

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::IsExecutableWithExports(cmTarget *this)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  if (this->TargetTypeValue == EXECUTABLE) {
    std::__cxx11::string::string((string *)&local_30,"ENABLE_EXPORTS",&local_31);
    bVar1 = GetPropertyAsBool(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmTarget::IsExecutableWithExports() const
{
  return (this->GetType() == cmStateEnums::EXECUTABLE &&
          this->GetPropertyAsBool("ENABLE_EXPORTS"));
}